

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-randart.c
# Opt level: O2

artifact_set_data * artifact_set_data_new(void)

{
  artifact_set_data *paVar1;
  int *piVar2;
  
  paVar1 = (artifact_set_data *)mem_zalloc(0xb0);
  piVar2 = (int *)mem_zalloc((ulong)z_info->a_max << 2);
  paVar1->base_power = piVar2;
  piVar2 = (int *)mem_zalloc(0x90);
  paVar1->avg_tv_power = piVar2;
  piVar2 = (int *)mem_zalloc(0x90);
  paVar1->min_tv_power = piVar2;
  piVar2 = (int *)mem_zalloc(0x90);
  paVar1->max_tv_power = piVar2;
  piVar2 = (int *)mem_zalloc((ulong)z_info->a_max << 2);
  paVar1->base_item_level = piVar2;
  piVar2 = (int *)mem_zalloc((ulong)z_info->a_max << 2);
  paVar1->base_item_prob = piVar2;
  piVar2 = (int *)mem_zalloc((ulong)z_info->a_max << 2);
  paVar1->base_art_alloc = piVar2;
  piVar2 = (int *)mem_zalloc(0x90);
  paVar1->tv_probs = piVar2;
  piVar2 = (int *)mem_zalloc(0x90);
  paVar1->tv_num = piVar2;
  piVar2 = (int *)mem_zalloc(0x178);
  paVar1->art_probs = piVar2;
  piVar2 = (int *)mem_zalloc(0x90);
  paVar1->tv_freq = piVar2;
  paVar1->hit_increment = 4;
  paVar1->dam_increment = 4;
  paVar1->hit_startval = 10;
  paVar1->dam_startval = 10;
  paVar1->ac_startval = 0xf;
  paVar1->ac_increment = 5;
  return paVar1;
}

Assistant:

static struct artifact_set_data *artifact_set_data_new(void)
{
	struct artifact_set_data *data = mem_zalloc(sizeof(*data));

	data->base_power = mem_zalloc(z_info->a_max * sizeof(int));
	data->avg_tv_power = mem_zalloc(TV_MAX * sizeof(int));
	data->min_tv_power = mem_zalloc(TV_MAX * sizeof(int));
	data->max_tv_power = mem_zalloc(TV_MAX * sizeof(int));
	data->base_item_level = mem_zalloc(z_info->a_max * sizeof(int));
	data->base_item_prob = mem_zalloc(z_info->a_max * sizeof(int));
	data->base_art_alloc = mem_zalloc(z_info->a_max * sizeof(int));
	data->tv_probs = mem_zalloc(TV_MAX * sizeof(int));
	data->tv_num = mem_zalloc(TV_MAX * sizeof(int));
	data->art_probs = mem_zalloc(ART_IDX_TOTAL * sizeof(int));
	data->tv_freq = mem_zalloc(TV_MAX * sizeof(int));

	/* Mean start and increment values for to_hit, to_dam and AC.  Update these
	 * if the algorithm changes.  They are used in frequency generation. */
	data->hit_increment = 4;
	data->dam_increment = 4;
	data->hit_startval = 10;
	data->dam_startval = 10;
	data->ac_startval = 15;
	data->ac_increment = 5;

	return data;
}